

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedlist_merge.c
# Opt level: O0

int linkedlist_merge(s_linkedlist *linked_list_to,s_linkedlist *linked_list_to_from)

{
  int iVar1;
  s_linkedlist *linked_list;
  s_linkedlist_node *local_30;
  s_linkedlist_node *linked_list_node_tmp;
  s_linkedlist *linked_list_tmp;
  s_linkedlist *linked_list_to_from_local;
  s_linkedlist *linked_list_to_local;
  
  linked_list = linkedlist_create();
  local_30 = linked_list_to_from->head;
  if (linked_list == (s_linkedlist *)0x0) {
    linked_list_to_local._4_4_ = -1;
  }
  else {
    for (; local_30 != (s_linkedlist_node *)0x0; local_30 = local_30->next) {
      iVar1 = linkedlist_add_back(linked_list,local_30->element);
      if (iVar1 == -1) {
        linkedlist_destroy(linked_list,(_func_void_void_ptr *)0x0);
        return -1;
      }
    }
    linked_list_to->tail->next = linked_list->head;
    linked_list_to->size = linked_list->size + linked_list_to->size;
    free(linked_list);
    linked_list_to_local._4_4_ = 0;
  }
  return linked_list_to_local._4_4_;
}

Assistant:

int linkedlist_merge(s_linkedlist *linked_list_to, s_linkedlist *linked_list_to_from) {
    s_linkedlist      *linked_list_tmp      = linkedlist_create();
    s_linkedlist_node *linked_list_node_tmp = linked_list_to_from->head;

    if (linked_list_tmp == NULL) {
        return (LINKEDLIST_RETVAL_FAILURE);
    }

    while (linked_list_node_tmp != NULL) {
        if (linkedlist_add_back(linked_list_tmp, linked_list_node_tmp->element) == LINKEDLIST_RETVAL_FAILURE) {
            linkedlist_destroy(linked_list_tmp, NULL);

            return (LINKEDLIST_RETVAL_FAILURE);
        }

        linked_list_node_tmp = linked_list_node_tmp->next;
    }

    linked_list_to->tail->next = linked_list_tmp->head;
    linked_list_to->size += linked_list_tmp->size;
    free(linked_list_tmp);

    return (LINKEDLIST_RETVAL_SUCCESS);
}